

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void binarySearch2(uint16_t *array,int32_t n,uint16_t target1,uint16_t target2,int32_t *index1,
                  int32_t *index2)

{
  int iVar1;
  uint16_t *local_48;
  uint16_t *local_40;
  int32_t half;
  uint16_t *base2;
  uint16_t *base1;
  int32_t *index2_local;
  int32_t *index1_local;
  uint16_t target2_local;
  uint16_t target1_local;
  int32_t n_local;
  uint16_t *array_local;
  
  base2 = array;
  base1 = array;
  n_local = n;
  if (n != 0) {
    for (; 1 < n_local; n_local = n_local - iVar1) {
      iVar1 = n_local >> 1;
      if (base1[iVar1] < target1) {
        local_40 = base1 + iVar1;
      }
      else {
        local_40 = base1;
      }
      base1 = local_40;
      if (base2[iVar1] < target2) {
        local_48 = base2 + iVar1;
      }
      else {
        local_48 = base2;
      }
      base2 = local_48;
    }
    *index1 = (int32_t)((long)base1 + ((long)(int)(uint)(*base1 < target1) * 2 - (long)array) >> 1);
    *index2 = (int32_t)((long)base2 + ((long)(int)(uint)(*base2 < target2) * 2 - (long)array) >> 1);
  }
  return;
}

Assistant:

static void binarySearch2(const uint16_t *array, int32_t n, uint16_t target1,
                          uint16_t target2, int32_t *index1, int32_t *index2) {
    const uint16_t *base1 = array;
    const uint16_t *base2 = array;
    if (n == 0) return;
    while (n > 1) {
        int32_t half = n >> 1;
        base1 = (base1[half] < target1) ? &base1[half] : base1;
        base2 = (base2[half] < target2) ? &base2[half] : base2;
        n -= half;
    }
    *index1 = (int32_t)((*base1 < target1) + base1 - array);
    *index2 = (int32_t)((*base2 < target2) + base2 - array);
}